

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O2

int Test_N_VMaxNormLocal(N_Vector X,sunindextype param_2,int myid)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  N_VConst(0xbfe0000000000000);
  set_element(X,param_2 + -1,-(double)(myid + 1));
  dVar2 = get_time();
  dVar3 = (double)N_VMaxNormLocal(X);
  sync_device(X);
  dVar4 = get_time();
  if (0.0 <= dVar3) {
    iVar1 = SUNRCompareTol(dVar3,(double)(myid + 1),0x3e50000000000000);
    if (iVar1 == 0) {
      iVar1 = 0;
      if (myid == 0) {
        puts("PASSED test -- N_VMaxNormLocal");
      }
      goto LAB_0010b782;
    }
  }
  printf(">>> FAILED test -- N_VMaxNormLocal, Proc %d\n",(ulong)(uint)myid);
  iVar1 = 1;
LAB_0010b782:
  max_time(X,dVar4 - dVar2);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n","N_VMaxNormLocal");
  }
  return iVar1;
}

Assistant:

int Test_N_VMaxNormLocal(N_Vector X, sunindextype local_length, int myid)
{
  int fails = 0, failure = 0;
  double start_time, stop_time, maxt;
  sunrealtype ans, myidp1;

  /* fill vector data */
  myidp1 = (sunrealtype)(myid + 1);
  N_VConst(NEG_HALF, X);
  set_element(X, local_length - 1, -myidp1);

  start_time = get_time();
  ans        = N_VMaxNormLocal(X);
  sync_device(X);
  stop_time = get_time();

  /* ans should equal myidp1 */
  failure =
    (ans < ZERO) ? 1 : SUNRCompareTol(ans, myidp1, SUNRsqrt(SUN_UNIT_ROUNDOFF));

  if (failure)
  {
    printf(">>> FAILED test -- N_VMaxNormLocal, Proc %d\n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VMaxNormLocal\n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VMaxNormLocal", maxt);

  return (fails);
}